

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeNVE.cpp
# Opt level: O0

void __thiscall OpenMD::FluctuatingChargeNVE::VelocityStep(FluctuatingChargeNVE *this,RealType dt)

{
  StuntDouble *in_RDI;
  double in_XMM0_Qa;
  RealType RVar1;
  StuntDouble *this_00;
  RealType cvel_00;
  RealType cmass;
  RealType cfrc;
  RealType cvel;
  Atom *atom;
  Molecule *mol;
  FluctuatingChargeIterator j;
  MoleculeIterator i;
  iterator *in_stack_ffffffffffffffc8;
  SimInfo *in_stack_ffffffffffffffd0;
  Molecule *local_28;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_20;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_18;
  double local_10;
  
  if ((in_RDI->globalIndex_ & 1) != 0) {
    local_10 = in_XMM0_Qa;
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_18);
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::__normal_iterator(&local_20);
    local_28 = SimInfo::beginMolecule
                         (in_stack_ffffffffffffffd0,(MoleculeIterator *)in_stack_ffffffffffffffc8);
    while (local_28 != (Molecule *)0x0) {
      for (in_stack_ffffffffffffffd0 =
                (SimInfo *)
                Molecule::beginFluctuatingCharge
                          ((Molecule *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
          in_stack_ffffffffffffffd0 != (SimInfo *)0x0;
          in_stack_ffffffffffffffd0 =
               (SimInfo *)
               Molecule::nextFluctuatingCharge
                         ((Molecule *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8)) {
        RVar1 = StuntDouble::getFlucQVel(in_RDI);
        this_00 = (StuntDouble *)StuntDouble::getFlucQFrc(in_RDI);
        cvel_00 = Atom::getChargeMass((Atom *)in_stack_ffffffffffffffd0);
        in_stack_ffffffffffffffc8 = (iterator *)((local_10 * (double)this_00) / cvel_00 + RVar1);
        StuntDouble::setFlucQVel(this_00,cvel_00);
      }
      local_28 = SimInfo::nextMolecule((SimInfo *)0x0,(MoleculeIterator *)in_stack_ffffffffffffffc8)
      ;
    }
  }
  return;
}

Assistant:

void FluctuatingChargeNVE::VelocityStep(RealType dt) {
    if (!hasFlucQ_) return;

    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;
    RealType cvel, cfrc, cmass;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        cvel  = atom->getFlucQVel();
        cfrc  = atom->getFlucQFrc();
        cmass = atom->getChargeMass();

        // velocity half step
        cvel += dt * cfrc / cmass;
        atom->setFlucQVel(cvel);
      }
    }
  }